

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

fdb_status fdb_init(fdb_config *config)

{
  sb_ops ops;
  bool bVar1;
  int64_t iVar2;
  uint uVar3;
  fdb_seqtree_opt_t fVar4;
  undefined1 uVar5;
  uint64_t uVar6;
  uint32_t uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  compactor_config c_config;
  filemgr_config f_config;
  byte local_171;
  size_t local_170;
  uint64_t local_168;
  compactor_config local_140;
  filemgr_config local_128;
  size_t local_b0;
  byte local_a8;
  undefined1 local_3c;
  uint32_t local_38;
  
  if (config == (fdb_config *)0x0) {
    get_default_config();
    local_168._0_1_ = local_128.encryption_key.bytes[0x10];
    local_168._1_1_ = local_128.encryption_key.bytes[0x11];
    local_168._2_1_ = local_128.encryption_key.bytes[0x12];
    local_168._3_1_ = local_128.encryption_key.bytes[0x13];
    local_168._4_1_ = local_128.encryption_key.bytes[0x14];
    local_168._5_1_ = local_128.encryption_key.bytes[0x15];
    local_168._6_1_ = local_128.encryption_key.bytes[0x16];
    local_168._7_1_ = local_128.encryption_key.bytes[0x17];
    local_170 = local_b0;
    local_171 = local_a8;
    uVar6 = local_128._8_8_;
    uVar3 = local_128.ncacheblock;
    fVar4 = (fdb_seqtree_opt_t)local_128.num_wal_shards;
    uVar5 = local_3c;
    uVar7 = local_38;
  }
  else {
    bVar1 = validate_fdb_config(config);
    if (!bVar1) {
      return FDB_RESULT_INVALID_CONFIG;
    }
    local_168 = config->compactor_sleep_duration;
    local_170 = config->num_compactor_threads;
    local_171 = config->enable_background_compactor;
    uVar6 = config->buffercache_size;
    uVar3 = config->blocksize;
    fVar4 = config->seqtree_opt;
    uVar5 = config->do_not_cache_doc_blocks;
    uVar7 = config->num_blocks_readahead;
  }
  pthread_spin_lock(&initial_lock);
  if (fdb_initialized.super___atomic_base<unsigned_char>._M_i == '\0') {
    iVar2 = get_memory_size();
    auVar8._8_4_ = (int)(uVar6 >> 0x20);
    auVar8._0_8_ = uVar6;
    auVar8._12_4_ = 0x45300000;
    dVar9 = (auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
    if ((double)iVar2 * 0.8 < dVar9) {
      pthread_spin_unlock(&initial_lock);
    }
    else {
      fdb_log_init((fdb_log_config)config->log_msg_level);
      local_128.ncacheblock = (int)(uVar6 / uVar3);
      local_128.blocksize = uVar3;
      local_128.seqtree_opt = fVar4;
      local_128.do_not_cache_doc_blocks = (bool)uVar5;
      local_128.num_blocks_readahead = uVar7;
      filemgr_init(&local_128);
      filemgr_set_lazy_file_deletion
                ((bool)(local_171 & 1),compactor_register_file_removing,compactor_is_file_removed);
      bVar1 = ver_superblock_support(0xdeadcafebeefc002);
      if (bVar1) {
        ops.get_default_config = sb_get_default_config;
        ops.init = sb_init;
        ops.read_latest = sb_read_latest;
        ops.alloc_block = sb_alloc_block;
        ops.is_writable = sb_bmp_is_writable;
        ops.get_bmp_revnum = sb_get_bmp_revnum;
        ops.get_min_live_revnum = sb_get_min_live_revnum;
        ops.release = sb_free;
        filemgr_set_sb_operation(ops);
        sb_bmp_mask_init();
      }
      local_140.sleep_duration = local_168;
      local_140.num_threads = local_170;
      local_140.spawn_threads = (bool)local_171;
      compactor_init(&local_140);
      LOCK();
      fdb_initialized.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)'\x01'
      ;
      UNLOCK();
    }
    if ((double)iVar2 * 0.8 < dVar9) {
      return FDB_RESULT_TOO_BIG_BUFFER_CACHE;
    }
  }
  pthread_spin_unlock(&initial_lock);
  return FDB_RESULT_SUCCESS;
}

Assistant:

LIBFDB_API
fdb_status fdb_init(fdb_config *config)
{
    fdb_config _config;
    struct filemgr_config f_config;

    if (config) {
        if (validate_fdb_config(config)) {
            _config = *config;
        } else {
            return FDB_RESULT_INVALID_CONFIG;
        }
    } else {
        _config = get_default_config();
    }

    // global initialization
    // initialized only once at first time
    if (!fdb_initialized) {

#ifndef SPIN_INITIALIZER
        init_initial_lock_status();
#endif

    }
    spin_lock(&initial_lock);
    if (!fdb_initialized) {
#if !defined(_ANDROID_) && !defined(__ANDROID__)
        // Some Android devices (e.g., Nexus 6) return incorrect RAM size.
        // We temporarily disable validity checking of block cache size
        // on Android platform at this time.
        double ram_size = (double) get_memory_size();
        if (ram_size * BCACHE_MEMORY_THRESHOLD < (double) _config.buffercache_size) {
            spin_unlock(&initial_lock);
            return FDB_RESULT_TOO_BIG_BUFFER_CACHE;
        }
#endif
        // Initialize log message routine.
        struct fdb_log_config _log_config;
        _log_config.log_msg_level = config->log_msg_level;
        fdb_log_init(_log_config);

        // initialize file manager and block cache
        f_config.blocksize = _config.blocksize;
        f_config.ncacheblock = _config.buffercache_size / _config.blocksize;
        f_config.seqtree_opt = _config.seqtree_opt;
        f_config.do_not_cache_doc_blocks = _config.do_not_cache_doc_blocks;
        f_config.num_blocks_readahead = _config.num_blocks_readahead;
        filemgr_init(&f_config);

        // WARNING: If background compactor is disabled,
        //          we should disable lazy deletion as well,
        //          since there will be no thread to do deletion.
        filemgr_set_lazy_file_deletion(_config.enable_background_compactor,
                                       compactor_register_file_removing,
                                       compactor_is_file_removed);
        if (ver_superblock_support(ver_get_latest_magic())) {
            struct sb_ops sb_ops = {sb_init, sb_get_default_config,
                                    sb_read_latest, sb_alloc_block,
                                    sb_bmp_is_writable, sb_get_bmp_revnum,
                                    sb_get_min_live_revnum, sb_free};
            filemgr_set_sb_operation(sb_ops);
            sb_bmp_mask_init();
        }

        // initialize compaction daemon
        compactor_config c_config;
        c_config = _config;
        compactor_init(&c_config);

        // initialize background flusher daemon
        // Temporarily disable background flushers until blockcache contention
        // issue is resolved.
        //bgf_config.num_threads = 0; //_config.num_bgflusher_threads;
        //bgflusher_init(&bgf_config);

        // Initialize breakpad
        //_dbg_handle_crashes(config->breakpad_minidump_dir);

        fdb_initialized = 1;
    }
    spin_unlock(&initial_lock);

    return FDB_RESULT_SUCCESS;
}